

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Field<google::protobuf::json_internal::UnparseProto2Descriptor> field)

{
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg;
  string_view str;
  bool bVar1;
  Type TVar2;
  float *pfVar3;
  double *pdVar4;
  Status *pSVar5;
  WriterOptions *pWVar6;
  long *plVar7;
  unsigned_long *puVar8;
  int *piVar9;
  uint *puVar10;
  bool *pbVar11;
  string *psVar12;
  basic_string_view<char,_std::char_traits<char>_> *pbVar13;
  Message **ppMVar14;
  Desc *desc;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> t;
  AlphaNum local_278;
  AlphaNum local_248;
  undefined1 local_218 [55];
  byte local_1e1;
  undefined1 local_1e0 [8];
  StatusOr<const_google::protobuf::Message_*> x_10;
  undefined1 local_1c8 [8];
  StatusOr<int> x_9;
  string local_198 [32];
  string_view local_178;
  byte local_161;
  undefined1 local_160 [8];
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> x_8;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_130;
  byte local_119;
  undefined1 local_118 [8];
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> x_7;
  undefined1 local_e8 [8];
  StatusOr<bool> x_6;
  undefined1 local_d0 [8];
  StatusOr<unsigned_int> x_5;
  undefined1 local_b8 [8];
  StatusOr<int> x_4;
  undefined1 local_98 [8];
  StatusOr<unsigned_long> x_3;
  undefined1 local_78 [8];
  StatusOr<long> x_2;
  undefined1 local_60 [8];
  StatusOr<double> x_1;
  undefined1 local_38 [8];
  StatusOr<float> x;
  bool is_default;
  Field<google::protobuf::json_internal::UnparseProto2Descriptor> field_local;
  JsonWriter *writer_local;
  Status *_status;
  
  x.super_StatusOrData<float>._15_1_ = 1;
  TVar2 = Proto2Descriptor::FieldType(field);
  switch(TVar2) {
  case TYPE_DOUBLE:
    UnparseProto2Descriptor::GetDouble((UnparseProto2Descriptor *)local_60,field);
    x_2.super_StatusOrData<long>.field_1.data_._7_1_ = 0;
    pSVar5 = absl::lts_20240722::StatusOr<double>::status((StatusOr<double> *)local_60);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      x_2.super_StatusOrData<long>.field_1.data_._7_1_ = 1;
    }
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if ((x_2.super_StatusOrData<long>.field_1.data_._7_1_ & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      pWVar6 = JsonWriter::options(writer);
      if (((pWVar6->allow_legacy_syntax & 1U) != 0) &&
         ((x.super_StatusOrData<float>._15_1_ & 1) != 0)) {
        pdVar4 = absl::lts_20240722::StatusOr<double>::operator*((StatusOr<double> *)local_60);
        bVar1 = std::isfinite(*pdVar4);
        if (!bVar1) {
          pdVar4 = absl::lts_20240722::StatusOr<double>::operator*((StatusOr<double> *)local_60);
          *pdVar4 = 0.0;
        }
      }
      pdVar4 = absl::lts_20240722::StatusOr<double>::operator*((StatusOr<double> *)local_60);
      JsonWriter::Write(writer,*pdVar4);
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<double>::~StatusOr((StatusOr<double> *)local_60);
    goto joined_r0x004d37f6;
  case TYPE_FLOAT:
    UnparseProto2Descriptor::GetFloat((UnparseProto2Descriptor *)local_38,field);
    pSVar5 = absl::lts_20240722::StatusOr<float>::status((StatusOr<float> *)local_38);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if (!(bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      pWVar6 = JsonWriter::options(writer);
      if (((pWVar6->allow_legacy_syntax & 1U) != 0) &&
         ((x.super_StatusOrData<float>._15_1_ & 1) != 0)) {
        pfVar3 = absl::lts_20240722::StatusOr<float>::operator*((StatusOr<float> *)local_38);
        bVar1 = std::isfinite(*pfVar3);
        if (!bVar1) {
          pfVar3 = absl::lts_20240722::StatusOr<float>::operator*((StatusOr<float> *)local_38);
          *pfVar3 = 0.0;
        }
      }
      pfVar3 = absl::lts_20240722::StatusOr<float>::operator*((StatusOr<float> *)local_38);
      JsonWriter::Write(writer,*pfVar3);
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<float>::~StatusOr((StatusOr<float> *)local_38);
joined_r0x004d37f6:
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 1) {
      return (Status)(uintptr_t)this;
    }
    goto LAB_004d4819;
  case TYPE_INT64:
  case TYPE_SFIXED64:
  case MAX_TYPE:
    UnparseProto2Descriptor::GetInt64((UnparseProto2Descriptor *)local_78,field);
    pSVar5 = absl::lts_20240722::StatusOr<long>::status((StatusOr<long> *)local_78);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if (!(bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      pWVar6 = JsonWriter::options(writer);
      if ((pWVar6->unquote_int64_if_possible & 1U) == 0) {
LAB_004d3adc:
        absl::lts_20240722::StatusOr<long>::operator*((StatusOr<long> *)local_78);
        MakeQuoted<long>((long)&x_3.super_StatusOrData<unsigned_long>.field_1);
        JsonWriter::Write<long>
                  (writer,(Quoted<long> *)&x_3.super_StatusOrData<unsigned_long>.field_1);
      }
      else {
        plVar7 = absl::lts_20240722::StatusOr<long>::operator*((StatusOr<long> *)local_78);
        bVar1 = RoundTripsThroughDouble<long>(*plVar7);
        if (!bVar1) goto LAB_004d3adc;
        plVar7 = absl::lts_20240722::StatusOr<long>::operator*((StatusOr<long> *)local_78);
        JsonWriter::Write(writer,*plVar7);
      }
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<long>::~StatusOr((StatusOr<long> *)local_78);
    break;
  case TYPE_UINT64:
  case TYPE_FIXED64:
    UnparseProto2Descriptor::GetUInt64((UnparseProto2Descriptor *)local_98,field);
    pSVar5 = absl::lts_20240722::StatusOr<unsigned_long>::status
                       ((StatusOr<unsigned_long> *)local_98);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if (!(bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      pWVar6 = JsonWriter::options(writer);
      if ((pWVar6->unquote_int64_if_possible & 1U) == 0) {
LAB_004d3ca2:
        absl::lts_20240722::StatusOr<unsigned_long>::operator*((StatusOr<unsigned_long> *)local_98);
        MakeQuoted<unsigned_long>((unsigned_long)&x_4.super_StatusOrData<int>.field_1);
        JsonWriter::Write<unsigned_long>
                  (writer,(Quoted<unsigned_long> *)&x_4.super_StatusOrData<int>.field_1);
      }
      else {
        puVar8 = absl::lts_20240722::StatusOr<unsigned_long>::operator*
                           ((StatusOr<unsigned_long> *)local_98);
        bVar1 = RoundTripsThroughDouble<unsigned_long>(*puVar8);
        if (!bVar1) goto LAB_004d3ca2;
        puVar8 = absl::lts_20240722::StatusOr<unsigned_long>::operator*
                           ((StatusOr<unsigned_long> *)local_98);
        JsonWriter::Write(writer,*puVar8);
      }
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<unsigned_long>::~StatusOr((StatusOr<unsigned_long> *)local_98);
    break;
  case TYPE_INT32:
  case TYPE_SFIXED32:
  case TYPE_SINT32:
    UnparseProto2Descriptor::GetInt32((UnparseProto2Descriptor *)local_b8,field);
    x_5.super_StatusOrData<unsigned_int>._15_1_ = 0;
    pSVar5 = absl::lts_20240722::StatusOr<int>::status((StatusOr<int> *)local_b8);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      x_5.super_StatusOrData<unsigned_int>._15_1_ = 1;
    }
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if ((x_5.super_StatusOrData<unsigned_int>._15_1_ & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      piVar9 = absl::lts_20240722::StatusOr<int>::operator*((StatusOr<int> *)local_b8);
      JsonWriter::Write(writer,*piVar9);
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<int>::~StatusOr((StatusOr<int> *)local_b8);
    break;
  case TYPE_FIXED32:
  case TYPE_UINT32:
    UnparseProto2Descriptor::GetUInt32((UnparseProto2Descriptor *)local_d0,field);
    x_6.super_StatusOrData<bool>._15_1_ = 0;
    pSVar5 = absl::lts_20240722::StatusOr<unsigned_int>::status((StatusOr<unsigned_int> *)local_d0);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      x_6.super_StatusOrData<bool>._15_1_ = 1;
    }
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if ((x_6.super_StatusOrData<bool>._15_1_ & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      puVar10 = absl::lts_20240722::StatusOr<unsigned_int>::operator*
                          ((StatusOr<unsigned_int> *)local_d0);
      JsonWriter::Write(writer,*puVar10);
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<unsigned_int>::~StatusOr((StatusOr<unsigned_int> *)local_d0);
    break;
  case TYPE_BOOL:
    UnparseProto2Descriptor::GetBool((UnparseProto2Descriptor *)local_e8,field);
    pSVar5 = absl::lts_20240722::StatusOr<bool>::status((StatusOr<bool> *)local_e8);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if (!(bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      pbVar11 = absl::lts_20240722::StatusOr<bool>::operator*((StatusOr<bool> *)local_e8);
      __str = "false";
      if ((*pbVar11 & 1U) != 0) {
        __str = "true";
      }
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&x_7.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1 + 8),__str);
      JsonWriter::Write(writer,stack0xffffffffffffff00);
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<bool>::~StatusOr((StatusOr<bool> *)local_e8);
    break;
  case TYPE_STRING:
    psVar12 = JsonWriter::ScratchBuf_abi_cxx11_(writer);
    UnparseProto2Descriptor::GetString
              ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_118,field,
               psVar12);
    local_119 = 0;
    pSVar5 = absl::lts_20240722::StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_>::
             status((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_118);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      local_119 = 1;
    }
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if ((local_119 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      pbVar13 = absl::lts_20240722::StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_>
                ::operator*((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            local_118);
      x_8.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1.data_.
      _M_str = (char *)pbVar13->_M_len;
      t._M_str = x_8.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                 field_1.data_._M_str;
      t._M_len = (size_t)&local_130;
      MakeQuoted<std::basic_string_view<char,std::char_traits<char>>>(t);
      JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(writer,&local_130);
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOr
              ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_118);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    UnparseProto2Descriptor::GetMessage((UnparseProto2Descriptor *)local_1e0,field);
    local_1e1 = 0;
    pSVar5 = absl::lts_20240722::StatusOr<const_google::protobuf::Message_*>::status
                       ((StatusOr<const_google::protobuf::Message_*> *)local_1e0);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      local_1e1 = 1;
    }
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if ((local_1e1 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      ppMVar14 = absl::lts_20240722::StatusOr<const_google::protobuf::Message_*>::operator*
                           ((StatusOr<const_google::protobuf::Message_*> *)local_1e0);
      msg = *ppMVar14;
      ppMVar14 = absl::lts_20240722::StatusOr<const_google::protobuf::Message_*>::operator*
                           ((StatusOr<const_google::protobuf::Message_*> *)local_1e0);
      desc = UnparseProto2Descriptor::GetDesc(*ppMVar14);
      WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                (this,writer,msg,desc,false);
      x_1.super_StatusOrData<double>.field_1._0_4_ = 1;
    }
    absl::lts_20240722::StatusOr<const_google::protobuf::Message_*>::~StatusOr
              ((StatusOr<const_google::protobuf::Message_*> *)local_1e0);
    return (Status)(uintptr_t)this;
  case TYPE_BYTES:
    psVar12 = JsonWriter::ScratchBuf_abi_cxx11_(writer);
    UnparseProto2Descriptor::GetString
              ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_160,field,
               psVar12);
    local_161 = 0;
    pSVar5 = absl::lts_20240722::StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_>::
             status((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_160);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      local_161 = 1;
    }
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if ((local_161 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      pWVar6 = JsonWriter::options(writer);
      if (((pWVar6->allow_legacy_syntax & 1U) == 0) ||
         ((x.super_StatusOrData<float>._15_1_ & 1) == 0)) {
        pbVar13 = absl::lts_20240722::
                  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                            ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             local_160);
        x_9.super_StatusOrData<int>._8_8_ = pbVar13->_M_len;
        str._M_len = pbVar13->_M_len;
        str._M_str = pbVar13->_M_str;
        JsonWriter::WriteBase64(writer,str);
      }
      else {
        pbVar13 = absl::lts_20240722::
                  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                            ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             local_160);
        absl::lts_20240722::CEscape_abi_cxx11_(local_198,pbVar13->_M_len,pbVar13->_M_str);
        local_178 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_198)
        ;
        JsonWriter::WriteBase64(writer,local_178);
        std::__cxx11::string::~string(local_198);
      }
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOr
              ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_160);
    break;
  case TYPE_ENUM:
    UnparseProto2Descriptor::GetEnumValue((UnparseProto2Descriptor *)local_1c8,field);
    x_10.super_StatusOrData<const_google::protobuf::Message_*>.field_1._7_1_ = 0;
    pSVar5 = absl::lts_20240722::StatusOr<int>::status((StatusOr<int> *)local_1c8);
    absl::lts_20240722::Status::Status((Status *)this,pSVar5);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    x_1.super_StatusOrData<double>.field_1._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if ((bool)x_1.super_StatusOrData<double>.field_1._0_1_) {
      x_10.super_StatusOrData<const_google::protobuf::Message_*>.field_1._7_1_ = 1;
    }
    x_1.super_StatusOrData<double>.field_1._1_3_ = 0;
    if ((x_10.super_StatusOrData<const_google::protobuf::Message_*>.field_1._7_1_ & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (x_1.super_StatusOrData<double>.field_1._0_4_ == 0) {
      piVar9 = absl::lts_20240722::StatusOr<int>::operator*((StatusOr<int> *)local_1c8);
      WriteEnum<google::protobuf::json_internal::UnparseProto2Descriptor>
                (writer,field,*piVar9,kUnquoted);
      x_1.super_StatusOrData<double>.field_1._0_4_ = 2;
    }
    absl::lts_20240722::StatusOr<int>::~StatusOr((StatusOr<int> *)local_1c8);
    break;
  default:
    absl::lts_20240722::AlphaNum::AlphaNum(&local_248,"unsupported field type: ");
    TVar2 = Proto2Descriptor::FieldType(field);
    absl::lts_20240722::AlphaNum::
    AlphaNum<google::protobuf::internal::FieldDescriptorLite::Type,void>(&local_278,TVar2);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_218,&local_248);
    local_218._32_16_ =
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_218);
    absl::lts_20240722::InvalidArgumentError(this,local_218._32_8_,local_218._40_8_);
    std::__cxx11::string::~string((string *)local_218);
    return (Status)(uintptr_t)this;
  }
  if (x_1.super_StatusOrData<double>.field_1._0_4_ != 1) {
LAB_004d4819:
    absl::lts_20240722::OkStatus();
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteSingular(JsonWriter& writer, Field<Traits> field,
                           Args&&... args) {
  // When the pack `args` is empty, the caller has requested printing the
  // default value.
  bool is_default = sizeof...(Args) == 0;
  switch (Traits::FieldType(field)) {
    case FieldDescriptor::TYPE_FLOAT: {
      auto x = Traits::GetFloat(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default &&
          !std::isfinite(*x)) {
        *x = 0;
      }
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_DOUBLE: {
      auto x = Traits::GetDouble(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default &&
          !std::isfinite(*x)) {
        *x = 0;
      }
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_SFIXED64:
    case FieldDescriptor::TYPE_SINT64:
    case FieldDescriptor::TYPE_INT64: {
      auto x = Traits::GetInt64(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().unquote_int64_if_possible &&
          RoundTripsThroughDouble(*x)) {
        writer.Write(*x);
      } else {
        writer.Write(MakeQuoted(*x));
      }
      break;
    }
    case FieldDescriptor::TYPE_FIXED64:
    case FieldDescriptor::TYPE_UINT64: {
      auto x = Traits::GetUInt64(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().unquote_int64_if_possible &&
          RoundTripsThroughDouble(*x)) {
        writer.Write(*x);
      } else {
        writer.Write(MakeQuoted(*x));
      }
      break;
    }
    case FieldDescriptor::TYPE_SFIXED32:
    case FieldDescriptor::TYPE_SINT32:
    case FieldDescriptor::TYPE_INT32: {
      auto x = Traits::GetInt32(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_FIXED32:
    case FieldDescriptor::TYPE_UINT32: {
      auto x = Traits::GetUInt32(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x);
      break;
    }
    case FieldDescriptor::TYPE_BOOL: {
      auto x = Traits::GetBool(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(*x ? "true" : "false");
      break;
    }
    case FieldDescriptor::TYPE_STRING: {
      auto x = Traits::GetString(field, writer.ScratchBuf(),
                                 std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      writer.Write(MakeQuoted(*x));
      break;
    }
    case FieldDescriptor::TYPE_BYTES: {
      auto x = Traits::GetString(field, writer.ScratchBuf(),
                                 std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      if (writer.options().allow_legacy_syntax && is_default) {
        // Although difficult to verify, it appears that the original ESF parser
        // fails to unescape the contents of a
        // google.protobuf.Field.default_value, which may potentially be
        // escaped if it is for a `bytes` field (note that default_value is a
        // `string` regardless of what type the field is).
        //
        // However, our parser's type.proto guts actually know to do this
        // correctly, so this bug must be manually re-introduced.
        writer.WriteBase64(absl::CEscape(*x));
      } else {
        writer.WriteBase64(*x);
      }
      break;
    }
    case FieldDescriptor::TYPE_ENUM: {
      auto x = Traits::GetEnumValue(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      WriteEnum<Traits>(writer, field, *x);
      break;
    }
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP: {
      auto x = Traits::GetMessage(field, std::forward<Args>(args)...);
      RETURN_IF_ERROR(x.status());
      return WriteMessage<Traits>(writer, **x, Traits::GetDesc(**x));
    }
    default:
      return absl::InvalidArgumentError(
          absl::StrCat("unsupported field type: ", Traits::FieldType(field)));
  }

  return absl::OkStatus();
}